

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::RationalTangentialDistortion::RationalTangentialDistortion
          (RationalTangentialDistortion *this,Properties *prop,int id)

{
  int in_ECX;
  int iVar1;
  undefined4 in_register_00000014;
  string local_38;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00173ab8;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 1,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 2,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 3,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 4,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k4",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 5,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k5",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 6,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"k6",(char *)(ulong)(uint)id,iVar1);
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->kd + 7,"0");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RationalTangentialDistortion::RationalTangentialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");
  prop.getValue(getCameraKey("k4", id).c_str(), kd[5], "0");
  prop.getValue(getCameraKey("k5", id).c_str(), kd[6], "0");
  prop.getValue(getCameraKey("k6", id).c_str(), kd[7], "0");
}